

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsioContextManager.cpp
# Opt level: O2

io_context * gmlc::networking::AsioContextManager::getContext(string *contextName)

{
  io_context *piVar1;
  _func_int **local_18;
  
  getContextPointer((AsioContextManager *)&stack0xffffffffffffffe8,contextName);
  piVar1 = (io_context *)local_18[8];
  CLI::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&stack0xfffffffffffffff0);
  return piVar1;
}

Assistant:

asio::io_context& AsioContextManager::getContext(const std::string& contextName)
{
    return getContextPointer(contextName)->getBaseContext();
}